

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_CustomComparator::_Run(_Test_CustomComparator *this)

{
  Slice local_1290;
  Slice local_1280;
  allocator local_1269;
  string local_1268 [39];
  allocator local_1241;
  string local_1240 [32];
  undefined1 local_1220 [424];
  char local_1078 [8];
  char buf [100];
  int local_100c;
  int i_1;
  int run;
  Slice local_ff8;
  allocator local_fe1;
  Snapshot local_fe0 [4];
  undefined1 local_fc0 [455];
  allocator local_df9;
  Snapshot local_df8 [4];
  undefined1 local_dd8 [455];
  allocator local_c11;
  Snapshot local_c10 [4];
  undefined1 local_bf0 [455];
  allocator local_a29;
  Snapshot local_a28 [4];
  undefined1 local_a08 [455];
  allocator local_841;
  Snapshot local_840 [4];
  undefined1 local_820 [455];
  allocator local_659;
  Snapshot local_658 [4];
  undefined1 local_638 [448];
  int local_478;
  allocator local_471;
  int i;
  allocator local_449;
  string local_448 [32];
  undefined1 local_428 [431];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [32];
  undefined1 local_230 [440];
  undefined1 local_78 [8];
  Options new_options;
  NumberComparator cmp;
  _Test_CustomComparator *this_local;
  
  _Run::NumberComparator::NumberComparator((NumberComparator *)&new_options.filter_policy);
  DBTest::CurrentOptions((Options *)local_78,&this->super_DBTest);
  new_options.comparator._0_1_ = 1;
  local_78 = (undefined1  [8])&new_options.filter_policy;
  new_options.compression = kNoCompression;
  new_options.reuse_logs = false;
  new_options._85_3_ = 0;
  new_options.info_log = (Logger *)0x3e8;
  DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)local_78);
  test::Tester::Tester
            ((Tester *)(local_230 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"[10]",&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"ten",&local_279);
  DBTest::Put((DBTest *)local_230,(string *)this,(string *)local_250);
  test::Tester::IsOk((Tester *)(local_230 + 8),(Status *)local_230);
  Status::~Status((Status *)local_230);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  test::Tester::~Tester((Tester *)(local_230 + 8));
  test::Tester::Tester
            ((Tester *)(local_428 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x61a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"[0x14]",&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"twenty",&local_471);
  DBTest::Put((DBTest *)local_428,(string *)this,(string *)local_448);
  test::Tester::IsOk((Tester *)(local_428 + 8),(Status *)local_428);
  Status::~Status((Status *)local_428);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  test::Tester::~Tester((Tester *)(local_428 + 8));
  for (local_478 = 0; local_478 < 2; local_478 = local_478 + 1) {
    test::Tester::Tester
              ((Tester *)(local_638 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x61c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_658,"[10]",&local_659);
    DBTest::Get((DBTest *)local_638,(string *)this,local_658);
    test::Tester::IsEq<char[4],std::__cxx11::string>
              ((Tester *)(local_638 + 0x20),(char (*) [4])"ten",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_638);
    std::__cxx11::string::~string((string *)local_638);
    std::__cxx11::string::~string((string *)local_658);
    std::allocator<char>::~allocator((allocator<char> *)&local_659);
    test::Tester::~Tester((Tester *)(local_638 + 0x20));
    test::Tester::Tester
              ((Tester *)(local_820 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x61d);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_840,"[0xa]",&local_841);
    DBTest::Get((DBTest *)local_820,(string *)this,local_840);
    test::Tester::IsEq<char[4],std::__cxx11::string>
              ((Tester *)(local_820 + 0x20),(char (*) [4])"ten",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_820);
    std::__cxx11::string::~string((string *)local_820);
    std::__cxx11::string::~string((string *)local_840);
    std::allocator<char>::~allocator((allocator<char> *)&local_841);
    test::Tester::~Tester((Tester *)(local_820 + 0x20));
    test::Tester::Tester
              ((Tester *)(local_a08 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x61e);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a28,"[20]",&local_a29);
    DBTest::Get((DBTest *)local_a08,(string *)this,local_a28);
    test::Tester::IsEq<char[7],std::__cxx11::string>
              ((Tester *)(local_a08 + 0x20),(char (*) [7])"twenty",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a08);
    std::__cxx11::string::~string((string *)local_a08);
    std::__cxx11::string::~string((string *)local_a28);
    std::allocator<char>::~allocator((allocator<char> *)&local_a29);
    test::Tester::~Tester((Tester *)(local_a08 + 0x20));
    test::Tester::Tester
              ((Tester *)(local_bf0 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x61f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_c10,"[0x14]",&local_c11);
    DBTest::Get((DBTest *)local_bf0,(string *)this,local_c10);
    test::Tester::IsEq<char[7],std::__cxx11::string>
              ((Tester *)(local_bf0 + 0x20),(char (*) [7])"twenty",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bf0);
    std::__cxx11::string::~string((string *)local_bf0);
    std::__cxx11::string::~string((string *)local_c10);
    std::allocator<char>::~allocator((allocator<char> *)&local_c11);
    test::Tester::~Tester((Tester *)(local_bf0 + 0x20));
    test::Tester::Tester
              ((Tester *)(local_dd8 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x620);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_df8,"[15]",&local_df9);
    DBTest::Get((DBTest *)local_dd8,(string *)this,local_df8);
    test::Tester::IsEq<char[10],std::__cxx11::string>
              ((Tester *)(local_dd8 + 0x20),(char (*) [10])"NOT_FOUND",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dd8);
    std::__cxx11::string::~string((string *)local_dd8);
    std::__cxx11::string::~string((string *)local_df8);
    std::allocator<char>::~allocator((allocator<char> *)&local_df9);
    test::Tester::~Tester((Tester *)(local_dd8 + 0x20));
    test::Tester::Tester
              ((Tester *)(local_fc0 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x621);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_fe0,"[0xf]",&local_fe1);
    DBTest::Get((DBTest *)local_fc0,(string *)this,local_fe0);
    test::Tester::IsEq<char[10],std::__cxx11::string>
              ((Tester *)(local_fc0 + 0x20),(char (*) [10])"NOT_FOUND",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fc0);
    std::__cxx11::string::~string((string *)local_fc0);
    std::__cxx11::string::~string((string *)local_fe0);
    std::allocator<char>::~allocator((allocator<char> *)&local_fe1);
    test::Tester::~Tester((Tester *)(local_fc0 + 0x20));
    Slice::Slice(&local_ff8,"[0]");
    Slice::Slice((Slice *)&i_1,"[9999]");
    DBTest::Compact(&this->super_DBTest,&local_ff8,(Slice *)&i_1);
  }
  for (local_100c = 0; local_100c < 2; local_100c = local_100c + 1) {
    buf[0x60] = '\0';
    buf[0x61] = '\0';
    buf[0x62] = '\0';
    buf[99] = '\0';
    for (; (int)buf._96_4_ < 1000; buf._96_4_ = buf._96_4_ + 1) {
      snprintf(local_1078,100,"[%d]",(ulong)(uint)(buf._96_4_ * 10));
      test::Tester::Tester
                ((Tester *)(local_1220 + 8),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                 ,0x629);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1240,local_1078,&local_1241);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1268,local_1078,&local_1269);
      DBTest::Put((DBTest *)local_1220,(string *)this,(string *)local_1240);
      test::Tester::IsOk((Tester *)(local_1220 + 8),(Status *)local_1220);
      Status::~Status((Status *)local_1220);
      std::__cxx11::string::~string(local_1268);
      std::allocator<char>::~allocator((allocator<char> *)&local_1269);
      std::__cxx11::string::~string(local_1240);
      std::allocator<char>::~allocator((allocator<char> *)&local_1241);
      test::Tester::~Tester((Tester *)(local_1220 + 8));
    }
    Slice::Slice(&local_1280,"[0]");
    Slice::Slice(&local_1290,"[1000000]");
    DBTest::Compact(&this->super_DBTest,&local_1280,&local_1290);
  }
  _Run::NumberComparator::~NumberComparator((NumberComparator *)&new_options.filter_policy);
  return;
}

Assistant:

TEST(DBTest, CustomComparator) {
  class NumberComparator : public Comparator {
   public:
    const char* Name() const override { return "test.NumberComparator"; }
    int Compare(const Slice& a, const Slice& b) const override {
      return ToNumber(a) - ToNumber(b);
    }
    void FindShortestSeparator(std::string* s, const Slice& l) const override {
      ToNumber(*s);  // Check format
      ToNumber(l);   // Check format
    }
    void FindShortSuccessor(std::string* key) const override {
      ToNumber(*key);  // Check format
    }

   private:
    static int ToNumber(const Slice& x) {
      // Check that there are no extra characters.
      ASSERT_TRUE(x.size() >= 2 && x[0] == '[' && x[x.size() - 1] == ']')
          << EscapeString(x);
      int val;
      char ignored;
      ASSERT_TRUE(sscanf(x.ToString().c_str(), "[%i]%c", &val, &ignored) == 1)
          << EscapeString(x);
      return val;
    }
  };
  NumberComparator cmp;
  Options new_options = CurrentOptions();
  new_options.create_if_missing = true;
  new_options.comparator = &cmp;
  new_options.filter_policy = nullptr;   // Cannot use bloom filters
  new_options.write_buffer_size = 1000;  // Compact more often
  DestroyAndReopen(&new_options);
  ASSERT_OK(Put("[10]", "ten"));
  ASSERT_OK(Put("[0x14]", "twenty"));
  for (int i = 0; i < 2; i++) {
    ASSERT_EQ("ten", Get("[10]"));
    ASSERT_EQ("ten", Get("[0xa]"));
    ASSERT_EQ("twenty", Get("[20]"));
    ASSERT_EQ("twenty", Get("[0x14]"));
    ASSERT_EQ("NOT_FOUND", Get("[15]"));
    ASSERT_EQ("NOT_FOUND", Get("[0xf]"));
    Compact("[0]", "[9999]");
  }

  for (int run = 0; run < 2; run++) {
    for (int i = 0; i < 1000; i++) {
      char buf[100];
      snprintf(buf, sizeof(buf), "[%d]", i * 10);
      ASSERT_OK(Put(buf, buf));
    }
    Compact("[0]", "[1000000]");
  }
}